

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O1

void __thiscall p2t::Triangle::MarkNeighbor(Triangle *this,Point *p1,Point *p2,Triangle *t)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = (ulong)this->points_[2] ^ (ulong)p1;
  uVar4 = (ulong)this->points_[1] ^ (ulong)p2;
  lVar1 = 0x20;
  if (uVar5 != 0 || uVar4 != 0) {
    uVar3 = (ulong)this->points_[1] ^ (ulong)p1;
    uVar6 = (ulong)this->points_[2] ^ (ulong)p2;
    if (uVar6 != 0 || uVar3 != 0) {
      uVar2 = (ulong)p1 ^ (ulong)this->points_[0];
      lVar1 = 0x28;
      if ((uVar6 != 0 || uVar2 != 0) &&
         (uVar6 = (ulong)this->points_[0] ^ (ulong)p2, uVar5 != 0 || uVar6 != 0)) {
        lVar1 = 0x30;
        if ((uVar2 != 0 || uVar4 != 0) && (uVar3 != 0 || uVar6 != 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/poly2tri/poly2tri/common/shapes.cc"
                        ,0x37,"void p2t::Triangle::MarkNeighbor(Point *, Point *, Triangle *)");
        }
      }
    }
  }
  *(Triangle **)(this->constrained_edge + lVar1) = t;
  return;
}

Assistant:

void Triangle::MarkNeighbor(Point* p1, Point* p2, Triangle* t)
{
  if ((p1 == points_[2] && p2 == points_[1]) || (p1 == points_[1] && p2 == points_[2]))
    neighbors_[0] = t;
  else if ((p1 == points_[0] && p2 == points_[2]) || (p1 == points_[2] && p2 == points_[0]))
    neighbors_[1] = t;
  else if ((p1 == points_[0] && p2 == points_[1]) || (p1 == points_[1] && p2 == points_[0]))
    neighbors_[2] = t;
  else
    assert(0);
}